

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbcursor.cpp
# Opt level: O0

void __thiscall QXcbCursorCacheKey::QXcbCursorCacheKey(QXcbCursorCacheKey *this,QCursor *c)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int *in_RDI;
  long in_FS_OFFSET;
  qint64 pixmapCacheKey;
  QBitmap local_50 [24];
  QBitmap local_38 [24];
  QPixmap local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QCursor::shape();
  *in_RDI = iVar1;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  if (*in_RDI == 0x18) {
    QCursor::pixmap();
    lVar2 = QPixmap::cacheKey();
    QPixmap::~QPixmap(local_20);
    if (lVar2 == 0) {
      QCursor::bitmap();
      uVar3 = QPixmap::cacheKey();
      *(undefined8 *)(in_RDI + 2) = uVar3;
      QBitmap::~QBitmap(local_38);
      QCursor::mask();
      uVar3 = QPixmap::cacheKey();
      *(undefined8 *)(in_RDI + 4) = uVar3;
      QBitmap::~QBitmap(local_50);
    }
    else {
      *(long *)(in_RDI + 2) = lVar2;
    }
  }
  QCursor::hotSpot();
  iVar1 = QPoint::x((QPoint *)0x19956d);
  in_RDI[6] = iVar1;
  QCursor::hotSpot();
  iVar1 = QPoint::y((QPoint *)0x199590);
  in_RDI[7] = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QXcbCursorCacheKey::QXcbCursorCacheKey(const QCursor &c)
    : shape(c.shape()), bitmapCacheKey(0), maskCacheKey(0)
{
    if (shape == Qt::BitmapCursor) {
        const qint64 pixmapCacheKey = c.pixmap().cacheKey();
        if (pixmapCacheKey) {
            bitmapCacheKey = pixmapCacheKey;
        } else {
            Q_ASSERT(!c.bitmap().isNull());
            Q_ASSERT(!c.mask().isNull());
            bitmapCacheKey = c.bitmap().cacheKey();
            maskCacheKey = c.mask().cacheKey();
        }
    }
    hotspotCacheKey.x = c.hotSpot().x();
    hotspotCacheKey.y = c.hotSpot().y();
}